

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

int __thiscall
hwnet::TCPListener::accept(TCPListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  socklen_t *len_local;
  sockaddr *addr__local;
  int *fd__local;
  TCPListener *this_local;
  
  do {
    iVar1 = ::accept(this->fd,__addr,__addr_len);
    *(int *)CONCAT44(in_register_00000034,__fd) = iVar1;
    if (-1 < iVar1) {
      return 0;
    }
    piVar2 = __errno_location();
  } while ((*piVar2 == 0x47) || (piVar2 = __errno_location(), *piVar2 == 0x67));
  piVar2 = __errno_location();
  return *piVar2;
}

Assistant:

int TCPListener::accept(int *fd_,struct sockaddr *addr_,socklen_t *len) {
	while((*fd_ = ::accept(this->fd,addr_,len)) < 0){
#ifdef EPROTO
		if(errno == EPROTO || errno == ECONNABORTED)
#else
		if(errno == ECONNABORTED)
#endif
			continue;
		else{
			return errno;
		}
	}
	return 0;	

}